

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void embree::ISPCScene::updateLight<embree::SceneGraph::DirectionalLight>
               (DirectionalLight *in,Light *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  fVar1 = (in->D).field_0.m128[0];
  fVar2 = (in->D).field_0.m128[1];
  fVar3 = (in->D).field_0.m128[2];
  fVar4 = (in->D).field_0.m128[3];
  fVar7 = fVar2 * fVar2;
  fVar8 = fVar3 * fVar3;
  fVar9 = fVar4 * fVar4;
  fVar10 = fVar7 + fVar1 * fVar1 + fVar8;
  fVar11 = fVar7 + fVar7 + fVar9;
  fVar8 = fVar7 + fVar8 + fVar8;
  fVar9 = fVar7 + fVar9 + fVar9;
  auVar5._4_4_ = fVar11;
  auVar5._0_4_ = fVar10;
  auVar5._8_4_ = fVar8;
  auVar5._12_4_ = fVar9;
  auVar6._4_4_ = fVar11;
  auVar6._0_4_ = fVar10;
  auVar6._8_4_ = fVar8;
  auVar6._12_4_ = fVar9;
  auVar6 = rsqrtss(auVar5,auVar6);
  fVar7 = auVar6._0_4_;
  fVar7 = fVar7 * fVar7 * fVar10 * -0.5 * fVar7 + fVar7 * 1.5;
  local_18.m128[0] = -fVar1 * fVar7;
  local_18.m128[1] = -fVar2 * fVar7;
  local_18.m128[2] = -fVar3 * fVar7;
  local_18.m128[3] = -fVar4 * fVar7;
  DirectionalLight_set(out,(Vec3fa *)&local_18.field_1,&in->E,1.0);
  return;
}

Assistant:

void ISPCScene::updateLight(const SceneGraph::DirectionalLight& in, Light* out) {
    DirectionalLight_set(out, -normalize(in.D), in.E, 1.0f);
  }